

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contacts.cc
# Opt level: O3

void RigidBodyDynamics::ForwardDynamicsContactsDirect
               (Model *model,VectorNd *Q,VectorNd *QDot,VectorNd *Tau,ConstraintSet *CS,
               VectorNd *QDDot)

{
  double *pdVar1;
  double *pdVar2;
  uint uVar3;
  double *pdVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  long lVar8;
  ulong uVar9;
  ActualDstType actualDst;
  ulong uVar10;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_38;
  
  CalcContactSystemVariables(model,Q,QDot,Tau,CS);
  local_38.m_storage.m_data = (double *)0x0;
  local_38.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_38,*(Index *)(CS + 200),1);
  pdVar4 = (Tau->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  lVar5 = *(long *)(CS + 0xc0);
  uVar10 = *(ulong *)(CS + 200);
  if (local_38.m_storage.m_rows != uVar10) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_38,uVar10,1);
    uVar10 = local_38.m_storage.m_rows;
  }
  uVar9 = uVar10 - ((long)uVar10 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar10) {
    lVar8 = 0;
    do {
      pdVar1 = pdVar4 + lVar8;
      dVar6 = pdVar1[1];
      pdVar2 = (double *)(lVar5 + lVar8 * 8);
      dVar7 = pdVar2[1];
      local_38.m_storage.m_data[lVar8] = *pdVar1 - *pdVar2;
      (local_38.m_storage.m_data + lVar8)[1] = dVar6 - dVar7;
      lVar8 = lVar8 + 2;
    } while (lVar8 < (long)uVar9);
  }
  if ((long)uVar9 < (long)uVar10) {
    do {
      local_38.m_storage.m_data[uVar9] = pdVar4[uVar9] - *(double *)(lVar5 + uVar9 * 8);
      uVar9 = uVar9 + 1;
    } while (uVar10 != uVar9);
  }
  SolveContactSystemDirect
            ((MatrixNd *)(CS + 0xa8),(MatrixNd *)(CS + 0xe0),(VectorNd *)&local_38,
             (VectorNd *)(CS + 0xd0),(VectorNd *)(CS + 0xf8),(VectorNd *)(CS + 0x110),
             (MatrixNd *)(CS + 0xf8),(VectorNd *)(CS + 0x110),(VectorNd *)(CS + 0x120),
             (LinearSolver *)CS);
  free(local_38.m_storage.m_data);
  uVar3 = model->dof_count;
  if ((ulong)uVar3 != 0) {
    lVar5 = *(long *)(CS + 0x120);
    pdVar4 = (QDDot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    uVar10 = 0;
    do {
      pdVar4[uVar10] = *(double *)(lVar5 + uVar10 * 8);
      uVar10 = uVar10 + 1;
    } while (uVar3 != uVar10);
  }
  uVar10 = *(ulong *)(CS + 0x70);
  if (uVar10 != 0) {
    lVar5 = *(long *)(CS + 0x78);
    lVar8 = *(long *)(CS + 0x120);
    uVar9 = 0;
    do {
      *(ulong *)(lVar5 + uVar9 * 8) =
           *(ulong *)(lVar8 + (ulong)(uVar3 + (int)uVar9) * 8) ^ 0x8000000000000000;
      uVar9 = uVar9 + 1;
    } while ((uVar9 & 0xffffffff) < uVar10);
  }
  return;
}

Assistant:

RBDL_DLLAPI
void ForwardDynamicsContactsDirect (
		Model &model,
		const VectorNd &Q,
		const VectorNd &QDot,
		const VectorNd &Tau,
		ConstraintSet &CS,
		VectorNd &QDDot
		) {
	LOG << "-------- " << __func__ << " --------" << std::endl;

	CalcContactSystemVariables (model, Q, QDot, Tau, CS);

	SolveContactSystemDirect (CS.H, CS.G, Tau - CS.C, CS.gamma, QDDot, CS.force, CS.A, CS.b, CS.x, CS.linear_solver);

	// Copy back QDDot
	for (unsigned int i = 0; i < model.dof_count; i++)
		QDDot[i] = CS.x[i];

	// Copy back contact forces
	for (unsigned int i = 0; i < CS.size(); i++) {
		CS.force[i] = -CS.x[model.dof_count + i];
	}
}